

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O3

string * __thiscall
Token::get_typename_abi_cxx11_(string *__return_storage_ptr__,Token *this,int type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = anon_var_dwarf_20cc4;
    pcVar1 = anon_var_dwarf_20cc4 + 0x12;
    break;
  case 2:
    pcVar2 = anon_var_dwarf_20cda;
    pcVar1 = anon_var_dwarf_20cda + 0x13;
    break;
  case 3:
    pcVar2 = anon_var_dwarf_20ce4;
    pcVar1 = anon_var_dwarf_20ce4 + 0x14;
    break;
  case 4:
    pcVar2 = anon_var_dwarf_20cfa;
    pcVar1 = anon_var_dwarf_20cfa + 0xd;
    break;
  case 5:
    pcVar2 = anon_var_dwarf_20d10;
    pcVar1 = anon_var_dwarf_20d10 + 0x10;
    break;
  case 6:
    pcVar2 = anon_var_dwarf_20d26;
    pcVar1 = anon_var_dwarf_20d26 + 0x11;
    break;
  case 7:
    pcVar2 = anon_var_dwarf_20d3c;
    pcVar1 = anon_var_dwarf_20d3c + 0xe;
    break;
  case 8:
    pcVar2 = anon_var_dwarf_20d52;
    pcVar1 = anon_var_dwarf_20d52 + 0x14;
    break;
  default:
    pcVar2 = anon_var_dwarf_20d5c;
    pcVar1 = anon_var_dwarf_20d5c + 0x11;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::get_typename(int type) {
    switch (type) {
        case KEY_WORD:
            return "(关键字)keyword";
        case OPERATOR:
            return "(操作符)operator";
        case DELIMITERS:
            return "(分隔符)delimiter";
        case IDENTIFIER:
            return "(标识符)id";
        case NUMBER:
            return "(数字)  number";
        case STRING:
            return "(字符串)string";
        case CHAR:
            return "(字符)  char";
        case ANNOTATION:
            return "(注解)  annotation";
        default:
            return "(未知)  unknown";
    }
}